

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O2

void __thiscall
Atari2600::TIA::Player::skip_pixels(Player *this,int count,int from_horizontal_counter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->pixel_counter;
  iVar2 = this->adder * count + this->pixel_position;
  iVar3 = 0x20;
  if (iVar2 < 0x20) {
    iVar3 = iVar2;
  }
  this->pixel_position = iVar3;
  this->pixel_counter = count + iVar1;
  if (3 < count + iVar1 && (iVar1 < 4 && this->copy_index_ == 0)) {
    this->latched_pixel4_time = (from_horizontal_counter - iVar1) + 4;
  }
  return;
}

Assistant:

inline void skip_pixels(const int count, int from_horizontal_counter) {
				int old_pixel_counter = pixel_counter;
				pixel_position = std::min(32, pixel_position + count * adder);
				pixel_counter += count;
				if(!copy_index_ && old_pixel_counter < 4 && pixel_counter >= 4) {
					latched_pixel4_time = from_horizontal_counter + 4 - old_pixel_counter;
				}
			}